

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O3

void __thiscall Handler::AddCommand(Handler *this,string *command,Event *event)

{
  pointer pcVar1;
  pointer *__ptr;
  __hashtable *__h;
  Event *local_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  Event *local_20;
  
  pcVar1 = (command->_M_dataplus)._M_p;
  local_48 = event;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + command->_M_string_length);
  local_48 = (Event *)0x0;
  local_20 = event;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this);
  if (local_20 != (Event *)0x0) {
    std::default_delete<Event>::operator()((default_delete<Event> *)&local_20,local_20);
  }
  local_20 = (Event *)0x0;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (local_48 != (Event *)0x0) {
    std::default_delete<Event>::operator()((default_delete<Event> *)&local_48,local_48);
  }
  return;
}

Assistant:

void Handler::AddCommand(const std::string &command, Event* event) {
    m_Commands.insert({command, std::unique_ptr<Event>(event)});
}